

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

_Bool sx_ishex(char *str)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  
  cVar2 = *str;
  if (cVar2 == '\0') {
    return true;
  }
  pcVar3 = str + 1;
  do {
    bVar4 = (byte)(((byte)(cVar2 + 0xbfU) < 0x1a) * ' ' + cVar2 + 0x9fU) < 6;
    bVar5 = (byte)(cVar2 - 0x30U) < 10;
    bVar1 = bVar5 || bVar4;
    if (!bVar5 && !bVar4) {
      return bVar1;
    }
    cVar2 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while (cVar2 != '\0');
  return bVar1;
}

Assistant:

bool sx_ishex(const char* str)
{
    while (*str) {
        if (!sx_ishexchar(*str))
            return false;
        ++str;
    }
    return true;
}